

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O3

int EncodeAlphaInternal(uint8_t *data,int width,int height,int method,int filter,int reduce_levels,
                       int effort_level,uint8_t *tmp_alpha,FilterTrial *result)

{
  VP8BitWriter *bw;
  bool bVar1;
  int iVar2;
  WebPEncodingError WVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  byte bVar7;
  uint8_t *size;
  bool bVar8;
  VP8LBitWriter tmp_bw;
  WebPConfig config;
  VP8LBitWriter local_1d8;
  WebPPicture local_1a8;
  WebPConfig local_a4;
  
  if (WebPFilters[filter] != (WebPFilterFunc)0x0) {
    (*WebPFilters[filter])(data,width,height,width,tmp_alpha);
    data = tmp_alpha;
  }
  size = (uint8_t *)(long)(height * width);
  if (method == 0) {
    bVar1 = true;
    bVar8 = false;
LAB_0012ce2e:
    bVar6 = bVar8 + (char)filter * '\x04';
    bVar7 = bVar6 | 0x10;
    if (reduce_levels == 0) {
      bVar7 = bVar6;
    }
    local_1a8.use_argb = CONCAT31(local_1a8.use_argb._1_3_,bVar7);
    bw = &result->bw;
    VP8BitWriterInit(bw,(size_t)(size + 1));
    iVar2 = VP8BitWriterAppend(bw,(uint8_t *)&local_1a8,1);
    if (iVar2 == 0) {
      bVar8 = false;
    }
    else {
      iVar2 = VP8BitWriterAppend(bw,data,(size_t)size);
      bVar8 = iVar2 != 0;
    }
    if (!bVar1) {
      VP8LBitWriterWipeOut(&local_1d8);
    }
    uVar4 = 0;
    if (bVar8) {
      uVar4 = (uint)((result->bw).error_ == 0);
    }
    result->score = (result->bw).pos_;
  }
  else {
    iVar2 = VP8LBitWriterInit(&local_1d8,(ulong)size >> 3);
    if (iVar2 != 0) {
      WebPPictureInitInternal(&local_1a8,0x20f);
      local_1a8.use_argb = 1;
      local_1a8.width = width;
      local_1a8.height = height;
      local_1a8.stats = &result->stats;
      iVar2 = WebPPictureAlloc(&local_1a8);
      if (iVar2 != 0) {
        (*WebPDispatchAlphaToGreen)
                  (data,width,local_1a8.width,local_1a8.height,local_1a8.argb,local_1a8.argb_stride)
        ;
        WebPConfigInitInternal(&local_a4,WEBP_PRESET_DEFAULT,75.0,0x20f);
        local_a4.lossless = 1;
        local_a4.exact = 1;
        local_a4.method = effort_level;
        if (effort_level == 6 && reduce_levels == 0) {
          local_a4.quality = 100.0;
        }
        else {
          local_a4.quality = (float)effort_level * 8.0;
        }
        WVar3 = VP8LEncodeStream(&local_a4,&local_1a8,&local_1d8,0);
        WebPPictureFree(&local_1a8);
        if (WVar3 == VP8_ENC_OK && local_1d8.error_ == 0) {
          puVar5 = VP8LBitWriterFinish(&local_1d8);
          local_1d8.cur_ =
               local_1d8.cur_ + ((long)(local_1d8.used_ + 7 >> 3) - (long)local_1d8.buf_);
          bVar8 = local_1d8.cur_ <= size;
          if (!bVar8) {
            VP8LBitWriterWipeOut(&local_1d8);
            puVar5 = data;
            local_1d8.cur_ = size;
          }
          bVar1 = !bVar8;
          data = puVar5;
          size = local_1d8.cur_;
          goto LAB_0012ce2e;
        }
        VP8LBitWriterWipeOut(&local_1d8);
      }
    }
    VP8LBitWriterWipeOut(&local_1d8);
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

static int EncodeAlphaInternal(const uint8_t* const data, int width, int height,
                               int method, int filter, int reduce_levels,
                               int effort_level,  // in [0..6] range
                               uint8_t* const tmp_alpha,
                               FilterTrial* result) {
  int ok = 0;
  const uint8_t* alpha_src;
  WebPFilterFunc filter_func;
  uint8_t header;
  const size_t data_size = width * height;
  const uint8_t* output = NULL;
  size_t output_size = 0;
  VP8LBitWriter tmp_bw;

  assert((uint64_t)data_size == (uint64_t)width * height);  // as per spec
  assert(filter >= 0 && filter < WEBP_FILTER_LAST);
  assert(method >= ALPHA_NO_COMPRESSION);
  assert(method <= ALPHA_LOSSLESS_COMPRESSION);
  assert(sizeof(header) == ALPHA_HEADER_LEN);

  filter_func = WebPFilters[filter];
  if (filter_func != NULL) {
    filter_func(data, width, height, width, tmp_alpha);
    alpha_src = tmp_alpha;
  }  else {
    alpha_src = data;
  }

  if (method != ALPHA_NO_COMPRESSION) {
    ok = VP8LBitWriterInit(&tmp_bw, data_size >> 3);
    ok = ok && EncodeLossless(alpha_src, width, height, effort_level,
                              !reduce_levels, &tmp_bw, &result->stats);
    if (ok) {
      output = VP8LBitWriterFinish(&tmp_bw);
      output_size = VP8LBitWriterNumBytes(&tmp_bw);
      if (output_size > data_size) {
        // compressed size is larger than source! Revert to uncompressed mode.
        method = ALPHA_NO_COMPRESSION;
        VP8LBitWriterWipeOut(&tmp_bw);
      }
    } else {
      VP8LBitWriterWipeOut(&tmp_bw);
      return 0;
    }
  }

  if (method == ALPHA_NO_COMPRESSION) {
    output = alpha_src;
    output_size = data_size;
    ok = 1;
  }

  // Emit final result.
  header = method | (filter << 2);
  if (reduce_levels) header |= ALPHA_PREPROCESSED_LEVELS << 4;

  VP8BitWriterInit(&result->bw, ALPHA_HEADER_LEN + output_size);
  ok = ok && VP8BitWriterAppend(&result->bw, &header, ALPHA_HEADER_LEN);
  ok = ok && VP8BitWriterAppend(&result->bw, output, output_size);

  if (method != ALPHA_NO_COMPRESSION) {
    VP8LBitWriterWipeOut(&tmp_bw);
  }
  ok = ok && !result->bw.error_;
  result->score = VP8BitWriterSize(&result->bw);
  return ok;
}